

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O0

int sys_pollgui(void)

{
  uint uVar1;
  uint local_14;
  double dStack_10;
  int didsomething;
  double now;
  
  dStack_10 = 0.0;
  local_14 = sys_domicrosleep(0);
  if ((local_14 == 0) || (dStack_10 = sys_getrealtime(), sys_pollgui::lasttime + 0.5 < dStack_10)) {
    uVar1 = sys_poll_togui();
    local_14 = uVar1 | local_14;
    if ((dStack_10 != 0.0) || (NAN(dStack_10))) {
      sys_pollgui::lasttime = dStack_10;
    }
  }
  return local_14;
}

Assistant:

int sys_pollgui(void)
{
    static double lasttime = 0;
    double now = 0;
    int didsomething = sys_domicrosleep(0);
    if (!didsomething || (now = sys_getrealtime()) > lasttime + 0.5)
    {
        didsomething |= sys_poll_togui();
        if (now)
            lasttime = now;
    }
    return (didsomething);
}